

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O3

Vec_Int_t * Gia_AigerReadMappingDoc(uchar **ppPos,int nObjs)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uchar *puVar13;
  int iVar14;
  
  uVar9 = (ulong)(uint)nObjs;
  puVar13 = *ppPos;
  lVar3 = 0;
  iVar14 = 0;
  do {
    uVar6 = iVar14 * 0x100;
    bVar1 = puVar13[lVar3];
    iVar14 = uVar6 + bVar1;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  *ppPos = puVar13 + 4;
  lVar3 = 0;
  uVar2 = 0;
  do {
    uVar2 = (uint)(puVar13 + 4)[lVar3] | uVar2 << 8;
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 4);
  puVar13 = puVar13 + 8;
  *ppPos = puVar13;
  piVar4 = (int *)calloc((long)(int)((uVar2 + 2) * iVar14 + nObjs),4);
  if (0 < iVar14) {
    uVar2 = 0;
    do {
      lVar3 = 0;
      uVar7 = 0;
      do {
        uVar7 = (long)((int)uVar7 << 8) | (ulong)puVar13[lVar3];
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 4);
      *ppPos = puVar13 + 4;
      lVar3 = 0;
      uVar8 = 0;
      do {
        uVar8 = (uint)(puVar13 + 4)[lVar3] | uVar8 << 8;
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 4);
      puVar13 = puVar13 + 8;
      *ppPos = puVar13;
      iVar14 = (int)uVar9;
      piVar4[uVar7] = iVar14;
      piVar4[iVar14] = uVar8;
      uVar11 = (ulong)(iVar14 + 1U);
      if (0 < (int)uVar8) {
        uVar10 = 0;
        uVar11 = (long)(int)(iVar14 + 1U);
        do {
          uVar9 = uVar11;
          lVar3 = 0;
          uVar12 = 0;
          do {
            uVar12 = (uint)puVar13[lVar3] | uVar12 << 8;
            lVar3 = lVar3 + 1;
          } while ((int)lVar3 != 4);
          piVar4[uVar9] = uVar12;
          puVar13 = puVar13 + 4;
          *ppPos = puVar13;
          uVar10 = uVar10 + 1;
          uVar11 = uVar9 + 1;
        } while (uVar10 != uVar8);
      }
      nObjs = (int)uVar9 + 2;
      uVar9 = (ulong)(uint)nObjs;
      piVar4[(int)uVar11] = (int)uVar7;
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uVar6 | bVar1));
  }
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nSize = nObjs;
  pVVar5->nCap = nObjs;
  pVVar5->pArray = piVar4;
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_AigerReadMappingDoc( unsigned char ** ppPos, int nObjs )
{
    int * pMapping, nLuts, LutSize, iRoot, nFanins, i, k, nOffset;
    nLuts    = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    LutSize  = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    pMapping = ABC_CALLOC( int, nObjs + (LutSize + 2) * nLuts );
    nOffset = nObjs;
    for ( i = 0; i < nLuts; i++ )
    {
        iRoot   = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        nFanins = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        pMapping[iRoot] = nOffset;
        // write one
        pMapping[ nOffset++ ] = nFanins; 
        for ( k = 0; k < nFanins; k++ )
        {
            pMapping[ nOffset++ ] = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        }
        pMapping[ nOffset++ ] = iRoot; 
    }
    return Vec_IntAllocArray( pMapping, nOffset );
}